

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void luaD_call(lua_State *L,StkId func,int nResults)

{
  ccall(L,func,nResults,1);
  return;
}

Assistant:

void luaD_call (lua_State *L, StkId func, int nResults) {
  ccall(L, func, nResults, 1);
}